

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O0

void __thiscall
YsSoundPlayer::APISpecificData::PopulateWriteBuffer
          (APISpecificData *this,uint *writeBufFilledInNStep,uint wavPtr,SoundData *wavFile,
          YSBOOL loop,int nThSound)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  uint local_5c;
  uint local_58;
  int c;
  int v;
  int i;
  int nByteToWrite;
  int writeBufLeftInByte;
  int wavByteLeft;
  int ptrInByte;
  uchar *dataPtr;
  uint currentFilledInNStep;
  int nThSound_local;
  YSBOOL loop_local;
  SoundData *wavFile_local;
  uint wavPtr_local;
  uint *writeBufFilledInNStep_local;
  APISpecificData *this_local;
  
  uVar1 = *writeBufFilledInNStep;
  *writeBufFilledInNStep = 0;
  wavFile_local._4_4_ = wavPtr;
  while (*writeBufFilledInNStep < this->bufSizeInNStep) {
    puVar5 = SoundData::DataPointerAtTimeStep(wavFile,wavFile_local._4_4_);
    uVar4 = this->bytePerTimeStep;
    uVar2 = SoundData::SizeInByte(wavFile);
    iVar3 = uVar2 - wavFile_local._4_4_ * uVar4;
    v = (this->bufSizeInNStep - *writeBufFilledInNStep) * this->bytePerTimeStep;
    if (iVar3 < v) {
      v = iVar3;
    }
    for (c = 0; c <= v + -2; c = c + 2) {
      if ((nThSound == 0) || (uVar1 < *writeBufFilledInNStep + (uint)c / this->bytePerTimeStep)) {
        this->writeBuf[*writeBufFilledInNStep * this->bytePerTimeStep + c] = puVar5[c];
        this->writeBuf[*writeBufFilledInNStep * this->bytePerTimeStep + c + 1] = puVar5[c + 1];
      }
      else {
        local_58 = (uint)puVar5[c] + (uint)puVar5[c + 1] * 0x100;
        if (0x7fff < local_58) {
          local_58 = local_58 - 0x10000;
        }
        local_5c = (uint)this->writeBuf[*writeBufFilledInNStep * this->bytePerTimeStep + c] +
                   (uint)this->writeBuf[*writeBufFilledInNStep * this->bytePerTimeStep + c + 1] *
                   0x100;
        if (0x7fff < local_5c) {
          local_5c = local_5c - 0x10000;
        }
        local_58 = local_5c + local_58;
        if (0x7fff < (int)local_58) {
          local_58 = 0x7fff;
        }
        if ((int)local_58 < -0x8000) {
          local_58 = -0x8000;
        }
        this->writeBuf[*writeBufFilledInNStep * this->bytePerTimeStep + c] = (uchar)local_58;
        this->writeBuf[*writeBufFilledInNStep * this->bytePerTimeStep + c + 1] =
             (uchar)(local_58 >> 8);
      }
    }
    *writeBufFilledInNStep = (uint)v / this->bytePerTimeStep + *writeBufFilledInNStep;
    wavFile_local._4_4_ = (uint)v / this->bytePerTimeStep + wavFile_local._4_4_;
    uVar4 = SoundData::NTimeStep(wavFile);
    if (uVar4 <= wavFile_local._4_4_) {
      if (loop != YSTRUE) break;
      wavFile_local._4_4_ = 0;
    }
  }
  if (*writeBufFilledInNStep < uVar1) {
    *writeBufFilledInNStep = uVar1;
  }
  return;
}

Assistant:

void YsSoundPlayer::APISpecificData::PopulateWriteBuffer(unsigned int &writeBufFilledInNStep,unsigned int wavPtr,const SoundData *wavFile,YSBOOL loop,int nThSound)
{
	auto currentFilledInNStep=writeBufFilledInNStep;
	writeBufFilledInNStep=0;
	while(writeBufFilledInNStep<bufSizeInNStep)
	{
		const unsigned char *dataPtr=wavFile->DataPointerAtTimeStep(wavPtr);
		const int ptrInByte=wavPtr*bytePerTimeStep;
		const int wavByteLeft=wavFile->SizeInByte()-ptrInByte;
		const int writeBufLeftInByte=(bufSizeInNStep-writeBufFilledInNStep)*bytePerTimeStep;
		
		int nByteToWrite;
		if(wavByteLeft<writeBufLeftInByte)
		{
			nByteToWrite=wavByteLeft;
		}
		else
		{
			nByteToWrite=writeBufLeftInByte;
		}

		for(int i=0; i<=nByteToWrite-2; i+=2)
		{
			if(0==nThSound || currentFilledInNStep<writeBufFilledInNStep+i/bytePerTimeStep)
			{
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i  ]=dataPtr[i];
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1]=dataPtr[i+1];
			}
			else
			{
				int v=(int)dataPtr[i]+(((int)dataPtr[i+1])<<8);
				if(32768<=v)
				{
					v-=65536;
				}
				int c=  (int)writeBuf[writeBufFilledInNStep*bytePerTimeStep+i]
				     +(((int)writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1])<<8);
				if(32768<=c)
				{
					c-=65536;
				}
				v+=c;
				if(32767<v)
				{
					v=32767;
				}
				if(v<-32768)
				{
					v=-32768;
				}
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i  ]=v&0xff;
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1]=((v>>8)&0xff);
			}
		}
		writeBufFilledInNStep+=nByteToWrite/bytePerTimeStep;
		wavPtr+=nByteToWrite/bytePerTimeStep;
		if(wavFile->NTimeStep()<=wavPtr)
		{
			if(YSTRUE!=loop)
			{
				break;
			}
			wavPtr=0;
		}
	}

	if(writeBufFilledInNStep<currentFilledInNStep)
	{
		writeBufFilledInNStep=currentFilledInNStep;
	}
}